

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O3

array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL> *
__thiscall
cppqc::detail::
ArrayOfStatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
::unGen(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
        *__return_storage_ptr__,
       ArrayOfStatelessGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
       *this,RngEngine *rng,size_t size)

{
  _Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  long lVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar2 = 0x10;
  do {
    *(long *)((long)__return_storage_ptr__->_M_elems + lVar2 + -0x10) =
         (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar2;
    *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar2 + -8) = 0;
    *(undefined1 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xb0);
  lVar2 = 0;
  do {
    _Var1.
    super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ._M_head_impl =
         (this->m_gen).m_gen._M_t.
         super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         .
         super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
    ;
    (**(code **)(*(long *)_Var1.
                          super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                          ._M_head_impl + 0x10))
              ((string *)local_50,
               _Var1.
               super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
               ._M_head_impl,rng,size);
    std::__cxx11::string::operator=
              ((string *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar2),
               (string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xa0);
  return __return_storage_ptr__;
}

Assistant:

std::array<T, N> unGen(RngEngine& rng, std::size_t size) const {
    std::array<T, N> result;
    for (size_t i = 0; i < N; i++)
      result[i] = m_gen.unGen(rng, size);
    return result;
  }